

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::IsSubSymbolOfBuiltType(DescriptorPool *this,string_view name)

{
  string_view name_00;
  bool bVar1;
  size_type __n;
  Symbol SVar2;
  size_type __pos;
  basic_string_view<char,_std::char_traits<char>_> key;
  string_view name_local;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  __pos = 0;
  while (__n = std::basic_string_view<char,_std::char_traits<char>_>::find(&name_local,'.',__pos),
        __n != 0xffffffffffffffff) {
    key = std::basic_string_view<char,_std::char_traits<char>_>::substr(&name_local,0,__n);
    SVar2 = Tables::FindSymbol((this->tables_)._M_t.
                               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               .
                               super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                               ._M_head_impl,key);
    if ((SVar2.ptr_)->symbol_type_ == '\0') break;
    if (1 < (byte)((SVar2.ptr_)->symbol_type_ - 9)) {
      return true;
    }
    __pos = __n + 1;
  }
  if (this->underlay_ == (DescriptorPool *)0x0) {
    bVar1 = false;
  }
  else {
    name_00._M_str = name_local._M_str;
    name_00._M_len = name_local._M_len;
    bVar1 = IsSubSymbolOfBuiltType(this->underlay_,name_00);
  }
  return bVar1;
}

Assistant:

bool DescriptorPool::IsSubSymbolOfBuiltType(absl::string_view name) const {
  for (size_t pos = name.find('.'); pos != name.npos;
       pos = name.find('.', pos + 1)) {
    auto prefix = name.substr(0, pos);
    Symbol symbol = tables_->FindSymbol(prefix);
    if (symbol.IsNull()) {
      break;
    }
    if (!symbol.IsPackage()) {
      // If the symbol type is anything other than PACKAGE, then its complete
      // definition is already known.
      return true;
    }
  }
  if (underlay_ != nullptr) {
    // Check to see if any prefix of this symbol exists in the underlay.
    return underlay_->IsSubSymbolOfBuiltType(name);
  }
  return false;
}